

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URL.cpp
# Opt level: O0

void __thiscall URL::URL(URL *this,string *url)

{
  __type _Var1;
  bool bVar2;
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  undefined1 local_a8 [44];
  int queryStringStartPos;
  int portEndPos;
  int hostNameEndPos;
  string local_58 [36];
  int local_34;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d;
  int protocollPos;
  allocator local_19;
  string *local_18;
  string *url_local;
  URL *this_local;
  
  local_18 = url;
  url_local = &this->_url;
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->_host);
  std::__cxx11::string::string((string *)&this->_protocoll);
  std::__cxx11::string::string((string *)&this->_portNumber);
  std::__cxx11::string::string((string *)&this->_relativePath);
  std::__cxx11::string::string((string *)&this->_queryString);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->SECUREPROTOCOLPORT,"443",&local_19);
  std::allocator<char>::~allocator((allocator<char> *)&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->REGULAREPROTOCOLPORT,"80",&local_2d);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->REGULARPROTOCOL,"http",&local_2e);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->SECUREPROTOCOL,"https",&local_2f);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f);
  std::__cxx11::string::operator=((string *)this,(string *)url);
  local_34 = std::__cxx11::string::find((char *)url,0x10d33a);
  if (local_34 == -1) {
    std::__cxx11::string::operator=((string *)&this->_protocoll,(string *)&this->REGULARPROTOCOL);
    local_34 = 0;
  }
  else {
    std::__cxx11::string::substr((ulong)local_58,(ulong)url);
    std::__cxx11::string::operator=((string *)&this->_protocoll,local_58);
    std::__cxx11::string::~string(local_58);
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)&portEndPos,(ulong)url);
    std::__cxx11::string::operator=((string *)url,(string *)&portEndPos);
    std::__cxx11::string::~string((string *)&portEndPos);
  }
  queryStringStartPos = std::__cxx11::string::find((char *)url,0x10d33c);
  local_a8._40_4_ = std::__cxx11::string::find((char *)url,0x10d33e);
  local_a8._36_4_ = std::__cxx11::string::find((char *)url,0x10d340);
  if (local_a8._40_4_ == -1) {
    GetProtocoll_abi_cxx11_((URL *)local_a8);
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_a8,&this->SECUREPROTOCOL);
    std::__cxx11::string::~string((string *)local_a8);
    if (_Var1) {
      std::__cxx11::string::operator=
                ((string *)&this->_portNumber,(string *)&this->SECUREPROTOCOLPORT);
    }
    else {
      std::__cxx11::string::operator=
                ((string *)&this->_portNumber,(string *)&this->REGULAREPROTOCOLPORT);
    }
  }
  else {
    if (queryStringStartPos == -1) {
      queryStringStartPos = std::__cxx11::string::size();
    }
    std::__cxx11::string::substr((ulong)local_c8,(ulong)url);
    std::__cxx11::string::operator=((string *)&this->_portNumber,local_c8);
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::string::substr((ulong)local_e8,(ulong)url);
    std::__cxx11::string::operator=((string *)&this->_host,local_e8);
    std::__cxx11::string::~string(local_e8);
  }
  bVar2 = std::operator==(&this->_host,"");
  if (bVar2) {
    if (queryStringStartPos == -1) {
      std::__cxx11::string::operator=((string *)&this->_host,(string *)url);
    }
    else {
      std::__cxx11::string::substr((ulong)local_108,(ulong)url);
      std::__cxx11::string::operator=((string *)&this->_host,local_108);
      std::__cxx11::string::~string(local_108);
    }
  }
  if (queryStringStartPos != -1) {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_128,(ulong)url);
    std::__cxx11::string::operator=((string *)&this->_relativePath,local_128);
    std::__cxx11::string::~string(local_128);
  }
  if (local_a8._36_4_ != -1) {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_148,(ulong)url);
    std::__cxx11::string::operator=((string *)&this->_queryString,local_148);
    std::__cxx11::string::~string(local_148);
  }
  return;
}

Assistant:

URL::URL(std::string url) {
  _url = url;
  // Get the protocoll end pos
  int protocollPos = url.find("://");

  if (protocollPos == std::string::npos) {
    _protocoll = REGULARPROTOCOL;
    protocollPos = 0;
  } else {
    _protocoll = url.substr(0, protocollPos);
    // Remove the protocoll part from the url
    url = url.substr(protocollPos+3, url.size());
  }

  /* Find the hostname ended by / or by : depending on if
  port is specified or not */

  int hostNameEndPos = url.find("/");
  int portEndPos = url.find(":");

  int queryStringStartPos = url.find("?");

  // If the port position do not exists, set default to 80
  if (portEndPos == std::string::npos) {
    if (this->GetProtocoll() == SECUREPROTOCOL) {
      _portNumber = SECUREPROTOCOLPORT;
    } else {
      _portNumber = REGULAREPROTOCOLPORT;
    }
  } else {
    /* If there is nothing more than the hostname e.g. www.google.com,
    get the last position
    */
    if (hostNameEndPos == string::npos) {
      hostNameEndPos = url.size();
    }
    // If there is a port specified, e.g. www.google.com:80/subfolder
    _portNumber = url.substr(portEndPos+1, hostNameEndPos-(portEndPos+1));
    _host = url.substr(0, portEndPos);
  }

  // If the host was not set by due to that the port was not specified
  if (_host == "") {
    if (hostNameEndPos == string::npos) {
      _host = url;
    } else {
      _host = url.substr(0, hostNameEndPos);
    }
  }

  // Set the relative part of the URL
  if (hostNameEndPos != string::npos) {
    _relativePath = url.substr(hostNameEndPos, url.size()-hostNameEndPos);
  }

  // Set the query string part of the URL
  if (queryStringStartPos != string::npos) {
      _queryString = url.substr(queryStringStartPos,
                                url.size()-queryStringStartPos);
    }
}